

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3RegisterLikeFunctions(sqlite3 *db,int caseSensitive)

{
  FuncDef *pFVar1;
  uint uVar2;
  compareInfo *pUserData;
  
  pUserData = &likeInfoAlt;
  if (caseSensitive == 0) {
    pUserData = &likeInfoNorm;
  }
  uVar2 = (uint)(caseSensitive != 0) * 8 + 4;
  sqlite3CreateFunc(db,"like",2,1,pUserData,likeFunc,
                    (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                    (_func_void_sqlite3_context_ptr *)0x0,(_func_void_sqlite3_context_ptr *)0x0,
                    (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                    (FuncDestructor *)0x0);
  sqlite3CreateFunc(db,"like",3,1,pUserData,likeFunc,
                    (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                    (_func_void_sqlite3_context_ptr *)0x0,(_func_void_sqlite3_context_ptr *)0x0,
                    (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                    (FuncDestructor *)0x0);
  pFVar1 = sqlite3FindFunction(db,"like",2,'\x01','\0');
  pFVar1->funcFlags = pFVar1->funcFlags | uVar2;
  pFVar1 = sqlite3FindFunction(db,"like",3,'\x01','\0');
  pFVar1->funcFlags = pFVar1->funcFlags | uVar2;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RegisterLikeFunctions(sqlite3 *db, int caseSensitive){
  struct compareInfo *pInfo;
  int flags;
  if( caseSensitive ){
    pInfo = (struct compareInfo*)&likeInfoAlt;
    flags = SQLITE_FUNC_LIKE | SQLITE_FUNC_CASE;
  }else{
    pInfo = (struct compareInfo*)&likeInfoNorm;
    flags = SQLITE_FUNC_LIKE;
  }
  sqlite3CreateFunc(db, "like", 2, SQLITE_UTF8, pInfo, likeFunc, 0, 0, 0, 0, 0);
  sqlite3CreateFunc(db, "like", 3, SQLITE_UTF8, pInfo, likeFunc, 0, 0, 0, 0, 0);
  sqlite3FindFunction(db, "like", 2, SQLITE_UTF8, 0)->funcFlags |= flags;
  sqlite3FindFunction(db, "like", 3, SQLITE_UTF8, 0)->funcFlags |= flags;
}